

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  undefined4 uVar4;
  mz_zip_internal_state *pmVar5;
  undefined4 *puVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  byte *pbVar21;
  int iVar22;
  bool bVar23;
  mz_uint32 t;
  byte *pbVar24;
  byte bVar25;
  
  pmVar5 = pZip->m_pState;
  puVar6 = (undefined4 *)(pmVar5->m_sorted_central_dir_offsets).m_p;
  uVar20 = pZip->m_total_files;
  iVar10 = (int)(uVar20 - 2) >> 1;
  iVar22 = iVar10;
  if (-1 < iVar10) {
joined_r0x003c546a:
    do {
      iVar19 = iVar10 * 2 + 1;
      if (iVar19 < (int)uVar20) {
        iVar16 = iVar10 * 2 + 2;
        uVar18 = 0;
        if (iVar16 < (int)uVar20) {
          pvVar7 = (pmVar5->m_central_dir).m_p;
          pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
          uVar14 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar19] * 4);
          uVar13 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar16] * 4);
          pbVar21 = (byte *)((long)pvVar7 + uVar14 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar7 + uVar14 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar7 + uVar13 + 0x1c);
          uVar18 = (uint)uVar3;
          if ((uint)uVar2 < (uint)uVar3) {
            uVar18 = (uint)uVar2;
          }
          pbVar12 = (byte *)((long)pvVar7 + uVar18 + uVar14 + 0x2e);
          if (uVar18 == 0) {
            bVar15 = 0;
            bVar25 = 0;
          }
          else {
            pbVar24 = (byte *)((long)pvVar7 + uVar13 + 0x2e);
            do {
              bVar25 = *pbVar21;
              bVar15 = bVar25 + 0x20;
              if (0x19 < (byte)(bVar25 + 0xbf)) {
                bVar15 = bVar25;
              }
              bVar1 = *pbVar24;
              bVar25 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar25 = bVar1;
              }
              if (bVar15 != bVar25) break;
              pbVar21 = pbVar21 + 1;
              pbVar24 = pbVar24 + 1;
            } while (pbVar21 < pbVar12);
          }
          bVar23 = bVar15 < bVar25;
          if (pbVar21 == pbVar12) {
            bVar23 = uVar2 < uVar3;
          }
          uVar18 = (uint)bVar23;
        }
        iVar19 = uVar18 + iVar19;
        uVar18 = puVar6[iVar10];
        pvVar7 = (pmVar5->m_central_dir).m_p;
        pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
        uVar13 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar18 * 4);
        uVar14 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar19] * 4);
        pbVar21 = (byte *)((long)pvVar7 + uVar13 + 0x2e);
        uVar2 = *(ushort *)((long)pvVar7 + uVar13 + 0x1c);
        uVar3 = *(ushort *)((long)pvVar7 + uVar14 + 0x1c);
        uVar9 = (uint)uVar3;
        if ((uint)uVar2 < (uint)uVar3) {
          uVar9 = (uint)uVar2;
        }
        pbVar12 = (byte *)((long)pvVar7 + uVar9 + uVar13 + 0x2e);
        if (uVar9 == 0) {
          bVar25 = 0;
          bVar15 = 0;
        }
        else {
          pbVar24 = (byte *)((long)pvVar7 + uVar14 + 0x2e);
          do {
            bVar15 = *pbVar21;
            bVar25 = bVar15 + 0x20;
            if (0x19 < (byte)(bVar15 + 0xbf)) {
              bVar25 = bVar15;
            }
            bVar1 = *pbVar24;
            bVar15 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar15 = bVar1;
            }
            if (bVar25 != bVar15) break;
            pbVar21 = pbVar21 + 1;
            pbVar24 = pbVar24 + 1;
          } while (pbVar21 < pbVar12);
        }
        bVar23 = bVar15 <= bVar25;
        if (pbVar21 == pbVar12) {
          bVar23 = uVar3 <= uVar2;
        }
        if (!bVar23) {
          puVar6[iVar10] = puVar6[iVar19];
          puVar6[iVar19] = uVar18;
          iVar10 = iVar19;
          goto joined_r0x003c546a;
        }
      }
      iVar10 = iVar22 + -1;
      bVar23 = 0 < iVar22;
      iVar22 = iVar10;
    } while (bVar23);
  }
  uVar13 = (ulong)uVar20;
  if (1 < (int)uVar20) {
    do {
      uVar14 = uVar13 - 1;
      uVar4 = puVar6[uVar13 - 1];
      puVar6[uVar13 - 1] = *puVar6;
      *puVar6 = uVar4;
      if (2 < (long)uVar13) {
        iVar10 = 0;
        iVar19 = 1;
        iVar22 = 0;
        do {
          uVar20 = 0;
          if ((long)(iVar10 + 2) < (long)uVar14) {
            pvVar7 = (pmVar5->m_central_dir).m_p;
            pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
            uVar11 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar19] * 4);
            uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar10 + 2] * 4);
            pbVar21 = (byte *)((long)pvVar7 + uVar11 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar7 + uVar11 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
            uVar20 = (uint)uVar3;
            if ((uint)uVar2 < (uint)uVar3) {
              uVar20 = (uint)uVar2;
            }
            pbVar12 = (byte *)((long)pvVar7 + uVar20 + uVar11 + 0x2e);
            if (uVar20 == 0) {
              bVar25 = 0;
              bVar15 = 0;
            }
            else {
              pbVar24 = (byte *)((long)pvVar7 + uVar17 + 0x2e);
              do {
                bVar15 = *pbVar21;
                bVar25 = bVar15 + 0x20;
                if (0x19 < (byte)(bVar15 + 0xbf)) {
                  bVar25 = bVar15;
                }
                bVar1 = *pbVar24;
                bVar15 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar15 = bVar1;
                }
                if (bVar25 != bVar15) break;
                pbVar21 = pbVar21 + 1;
                pbVar24 = pbVar24 + 1;
              } while (pbVar21 < pbVar12);
            }
            bVar23 = bVar25 < bVar15;
            if (pbVar21 == pbVar12) {
              bVar23 = uVar2 < uVar3;
            }
            uVar20 = (uint)bVar23;
          }
          iVar16 = uVar20 + iVar19;
          uVar20 = puVar6[iVar22];
          pvVar7 = (pmVar5->m_central_dir).m_p;
          pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
          uVar11 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar20 * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar16] * 4);
          pbVar21 = (byte *)((long)pvVar7 + uVar11 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar7 + uVar11 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
          uVar18 = (uint)uVar3;
          if ((uint)uVar2 < (uint)uVar3) {
            uVar18 = (uint)uVar2;
          }
          pbVar12 = (byte *)((long)pvVar7 + uVar18 + uVar11 + 0x2e);
          if (uVar18 == 0) {
            bVar25 = 0;
            bVar15 = 0;
          }
          else {
            pbVar24 = (byte *)((long)pvVar7 + uVar17 + 0x2e);
            do {
              bVar15 = *pbVar21;
              bVar25 = bVar15 + 0x20;
              if (0x19 < (byte)(bVar15 + 0xbf)) {
                bVar25 = bVar15;
              }
              bVar1 = *pbVar24;
              bVar15 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar15 = bVar1;
              }
              if (bVar25 != bVar15) break;
              pbVar21 = pbVar21 + 1;
              pbVar24 = pbVar24 + 1;
            } while (pbVar21 < pbVar12);
          }
          bVar23 = bVar15 <= bVar25;
          if (pbVar21 == pbVar12) {
            bVar23 = uVar3 <= uVar2;
          }
          if (bVar23) break;
          puVar6[iVar22] = puVar6[iVar16];
          puVar6[iVar16] = uVar20;
          iVar10 = iVar16 * 2;
          iVar19 = iVar16 * 2 + 1;
          iVar22 = iVar16;
        } while ((long)iVar19 < (long)uVar14);
      }
      bVar23 = 2 < (long)uVar13;
      uVar13 = uVar14;
    } while (bVar23);
  }
  return;
}

Assistant:

static void
mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip) {
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(
      &pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  int start = (size - 2) >> 1, end;
  while (start >= 0) {
    int child, root = start;
    for (;;) {
      if ((child = (root << 1) + 1) >= size)
        break;
      child +=
          (((child + 1) < size) &&
           (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                        pIndices[child], pIndices[child + 1])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    start--;
  }

  end = size - 1;
  while (end > 0) {
    int child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for (;;) {
      if ((child = (root << 1) + 1) >= end)
        break;
      child +=
          (((child + 1) < end) &&
           mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[child], pIndices[child + 1]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    end--;
  }
}